

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.cpp
# Opt level: O2

bool checkValidMeasurement(Vector3 *in,string *measurement_type,bool check_also_zero_vector)

{
  bool bVar1;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (((int)CONCAT71(in_register_00000011,check_also_zero_vector) == 0) ||
     (bVar1 = isZeroVector(in), !bVar1)) {
    bVar1 = isVectorNaN(in);
    if (!bVar1) {
      return true;
    }
    std::operator+(&local_30,measurement_type," measurements are invalid. Has NaN elements.");
    iDynTree::reportError("AttitudeEstimator","checkValidMeasurement",local_30._M_dataplus._M_p);
  }
  else {
    std::operator+(&local_30,measurement_type,
                   " measurements are invalid. Expecting a non-zero vector.");
    iDynTree::reportError("AttitudeEstimator","checkValidMeasurement",local_30._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return false;
}

Assistant:

bool checkValidMeasurement(const iDynTree::Vector3& in, const std::string& measurement_type, bool check_also_zero_vector)
{
    if (check_also_zero_vector)
    {
        if (isZeroVector(in))
        {
            iDynTree::reportError("AttitudeEstimator", "checkValidMeasurement",
                                  (measurement_type + " measurements are invalid. Expecting a non-zero vector.").c_str());
            return false;
        }
    }

    if (isVectorNaN(in))
    {
        iDynTree::reportError("AttitudeEstimator", "checkValidMeasurement",
                              (measurement_type + " measurements are invalid. Has NaN elements.").c_str());
        return false;
    }

    return true;
}